

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall NetworkAddress::fromBuffer(NetworkAddress *this,uint8_t *buf,size_t max_len)

{
  IPAddress local_48;
  uint8_t *local_38;
  uint8_t *ptr;
  size_t sStack_28;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  NetworkAddress *this_local;
  
  sStack_28 = max_len;
  max_len_local = (size_t)buf;
  buf_local = (uint8_t *)this;
  ptr._4_4_ = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  this_local._4_4_ = ptr._4_4_;
  if (-1 < ptr._4_4_) {
    local_38 = (uint8_t *)(max_len_local + (long)ptr._4_4_);
    IPAddress::IPAddress(&local_48,local_38);
    IPAddress::operator=(&this->_value,&local_48);
    IPAddress::~IPAddress(&local_48);
    this_local._4_4_ = (int)local_38 - (int)max_len_local;
  }
  return this_local._4_4_;
}

Assistant:

int NetworkAddress::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    // byte tempAddress[4];
    // tempAddress[0] = *ptr++;
    // tempAddress[1] = *ptr++;
    // tempAddress[2] = *ptr++;
    // tempAddress[3] = *ptr++;

    _value = IPAddress(ptr);
    return ptr - buf;
}